

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_affine.cpp
# Opt level: O1

void __thiscall agg::trans_affine::scaling(trans_affine *this,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar9 = this->sx;
  dVar10 = this->shy;
  dVar11 = this->shx;
  dVar1 = this->sy;
  dVar2 = this->tx;
  dVar3 = this->ty;
  dVar4 = rotation(this);
  dVar12 = cos(-dVar4);
  dVar5 = sin(-dVar4);
  dVar6 = sin(-dVar4);
  dVar4 = cos(-dVar4);
  dVar8 = dVar9 * dVar12 - dVar10 * dVar6;
  dVar7 = dVar11 * dVar12 - dVar1 * dVar6;
  dVar12 = (dVar12 * dVar2 - dVar6 * dVar3) + 0.0;
  dVar9 = dVar9 * dVar5 + dVar10 * dVar4;
  dVar11 = dVar11 * dVar5 + dVar1 * dVar4;
  dVar10 = dVar2 * dVar5 + dVar3 * dVar4 + 0.0;
  *x = (dVar7 + dVar8 + dVar12) - (dVar8 * 0.0 + dVar7 * 0.0 + dVar12);
  *y = (dVar11 + dVar9 + dVar10) - (dVar9 * 0.0 + dVar11 * 0.0 + dVar10);
  return;
}

Assistant:

void trans_affine::scaling(double* x, double* y) const
    {
        double x1 = 0.0;
        double y1 = 0.0;
        double x2 = 1.0;
        double y2 = 1.0;
        trans_affine t(*this);
        t *= trans_affine_rotation(-rotation());
        t.transform(&x1, &y1);
        t.transform(&x2, &y2);
        *x = x2 - x1;
        *y = y2 - y1;
    }